

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

void __thiscall cppnet::Bitmap::Clear(Bitmap *this)

{
  reference pvVar1;
  float fVar2;
  int32_t next_vec_index;
  Bitmap *this_local;
  
  while (this->_vec_bitmap != 0) {
    fVar2 = log2f((float)((this->_vec_bitmap & -this->_vec_bitmap) + 1));
    pvVar1 = std::vector<long,_std::allocator<long>_>::operator[](&this->_bitmap,(long)(int)fVar2);
    *pvVar1 = 0;
    this->_vec_bitmap = this->_vec_bitmap & this->_vec_bitmap - 1;
  }
  return;
}

Assistant:

void Bitmap::Clear() {
    while (_vec_bitmap != 0) {
        int32_t next_vec_index = (int32_t)std::log2f(float((_vec_bitmap & (-(int32_t)_vec_bitmap)) + 1));
        _bitmap[next_vec_index] = 0;
        _vec_bitmap = _vec_bitmap & (_vec_bitmap - 1);
    }
}